

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

vector<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
* __thiscall
libtorrent::aux::session_impl::add_port_mapping
          (vector<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
           *__return_storage_ptr__,session_impl *this,portmap_protocol t,int external_port,
          int param_3)

{
  pointer psVar1;
  upnp *this_00;
  iterator iVar2;
  natpmp *this_01;
  element_type *peVar3;
  shared_ptr<libtorrent::aux::listen_socket_t> *s;
  pointer psVar4;
  bool bVar5;
  endpoint ep;
  address local_b8;
  data_union local_94;
  data_union local_78;
  data_union local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar4 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    do {
      peVar3 = (psVar4->
               super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      bVar5 = (peVar3->local_endpoint).impl_.data_.base.sa_family != 2;
      if (bVar5) {
        local_b8.ipv6_address_.addr_.__in6_u._0_8_ =
             *(undefined8 *)((long)&(peVar3->local_endpoint).impl_.data_ + 8);
        local_b8.ipv6_address_.addr_.__in6_u._8_8_ =
             *(undefined8 *)((long)&(peVar3->local_endpoint).impl_.data_ + 0x10);
        local_b8.ipv6_address_.scope_id_ =
             (unsigned_long)(peVar3->local_endpoint).impl_.data_.v6.sin6_scope_id;
        local_b8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_b8.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(peVar3->local_endpoint).impl_.data_.v4.sin_addr.s_addr;
        local_b8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_b8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_b8.ipv6_address_.scope_id_ = 0;
      }
      local_b8.type_ = (anon_enum_32)bVar5;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_94.base,&local_b8,
                 (unsigned_short)param_3);
      peVar3 = (psVar4->
               super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (peVar3->upnp_mapper).
                super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 != (upnp *)0x0) {
        local_58._0_8_ = local_94._0_8_;
        local_58._20_8_ = local_94._20_8_;
        local_b8.type_ =
             (anon_enum_32)
             upnp::add_mapping(this_00,t,external_port,(endpoint *)&local_58.base,&peVar3->device);
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>>>
          ::
          _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>>
                    ((vector<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>>>
                      *)__return_storage_ptr__,iVar2,
                     (strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)&local_b8);
        }
        else {
          (iVar2._M_current)->m_val = local_b8.type_;
          (__return_storage_ptr__->
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        peVar3 = (psVar4->
                 super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      }
      this_01 = (peVar3->natpmp_mapper).
                super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_01 != (natpmp *)0x0) {
        local_78._0_8_ = local_94._0_8_;
        local_78._20_8_ = local_94._20_8_;
        local_b8.type_ =
             (anon_enum_32)
             natpmp::add_mapping(this_01,t,external_port,(endpoint *)&local_78.base,&peVar3->device)
        ;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>>>
          ::
          _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>>
                    ((vector<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>>>
                      *)__return_storage_ptr__,iVar2,
                     (strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)&local_b8);
        }
        else {
          (iVar2._M_current)->m_val = local_b8.type_;
          (__return_storage_ptr__->
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<port_mapping_t> session_impl::add_port_mapping(portmap_protocol const t
		, int const external_port
		, int const local_port)
	{
		std::vector<port_mapping_t> ret;
		for (auto& s : m_listen_sockets)
		{
			tcp::endpoint const ep{s->local_endpoint.address(), static_cast<std::uint16_t>(local_port)};
			if (s->upnp_mapper) ret.push_back(s->upnp_mapper->add_mapping(
				t, external_port, ep, s->device));
			if (s->natpmp_mapper) ret.push_back(s->natpmp_mapper->add_mapping(
				t, external_port, ep, s->device));
		}
		return ret;
	}